

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::Pop
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          BGIP_BnB_NodePtr *node)

{
  bool bVar1;
  undefined8 uVar2;
  shared_ptr<BGIP_BnB_Node> *in_RDI;
  E *unaff_retaddr;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffffc8;
  priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
  *in_stack_ffffffffffffffe0;
  shared_ptr<BGIP_BnB_Node> *arg;
  
  arg = in_RDI;
  std::
  priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
  ::top((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
         *)0x15c619);
  bVar1 = boost::operator!=(in_RDI,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::pop(in_stack_ffffffffffffffe0);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  E::E(unaff_retaddr,(char *)arg);
  __cxa_throw(uVar2,&E::typeinfo,E::~E);
}

Assistant:

void Pop(BGIP_BnB_NodePtr node)
    {
        if(_m_openQueue->top()!=node)
            throw(E("Node to be popped is not the one specified"));

        _m_openQueue->pop();
    }